

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_gej_var(secp256k1_ge *r,secp256k1_gej *a)

{
  undefined1 local_68 [8];
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_gej *a_local;
  secp256k1_ge *r_local;
  
  r->infinity = a->infinity;
  if (a->infinity == 0) {
    secp256k1_fe_inv_var(&a->z,&a->z);
    secp256k1_fe_sqr((secp256k1_fe *)(z3.n + 4),&a->z);
    secp256k1_fe_mul((secp256k1_fe *)local_68,&a->z,(secp256k1_fe *)(z3.n + 4));
    secp256k1_fe_mul(&a->x,&a->x,(secp256k1_fe *)(z3.n + 4));
    secp256k1_fe_mul(&a->y,&a->y,(secp256k1_fe *)local_68);
    secp256k1_fe_set_int(&a->z,1);
    memcpy(r,a,0x28);
    memcpy(&r->y,&a->y,0x28);
  }
  return;
}

Assistant:

static void secp256k1_ge_set_gej_var(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    r->infinity = a->infinity;
    if (a->infinity) {
        return;
    }
    secp256k1_fe_inv_var(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    r->x = a->x;
    r->y = a->y;
}